

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O2

void __thiscall
glcts::GPUShader5TextureGatherOffsetColor2DRepeatCaseTest::prepareVertexBuffersData
          (GPUShader5TextureGatherOffsetColor2DRepeatCaseTest *this,
          vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
          *vertex_buffer_infos)

{
  int iVar1;
  int iVar2;
  GLuint GVar3;
  uint i;
  long lVar4;
  VertexBufferInfo info;
  
  iVar1 = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
          super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  iVar2 = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
          super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  std::vector<int,_std::allocator<int>_>::resize(&this->m_offsets_buffer_data,0x100);
  TestCaseBase::randomSeed((TestCaseBase *)this,1);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    GVar3 = TestCaseBase::randomFormula((TestCaseBase *)this,(iVar2 - iVar1) + 1);
    (this->m_offsets_buffer_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4] = GVar3 + iVar1;
  }
  info.attribute_name = "offsets";
  info.n_components = 2;
  info.type = 0x1404;
  info.data = (this->m_offsets_buffer_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  info.data_size =
       *(int *)&(this->m_offsets_buffer_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (int)info.data & 0xfffffffc;
  std::
  vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
  ::push_back(vertex_buffer_infos,&info);
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetColor2DRepeatCaseTest::prepareVertexBuffersData(
	std::vector<VertexBufferInfo>& vertex_buffer_infos)
{
	/* Constats for offsets and size of buffer */
	const unsigned int n_total_components = m_n_vertices * m_n_offsets_components;

	/* Limits used to generate offsets */
	const glw::GLint min_ptgo = m_min_texture_gather_offset;
	const glw::GLint max_ptgo = m_max_texture_gather_offset;

	/* Storage for offsets */
	m_offsets_buffer_data.resize(n_total_components);

	/* Set the seed for random number generator */
	randomSeed(1);

	/* Generate offsets */
	for (unsigned int i = 0; i < n_total_components; ++i)
	{
		m_offsets_buffer_data[i] =
			static_cast<glw::GLint>(randomFormula(static_cast<glw::GLuint>(max_ptgo - min_ptgo + 1))) + min_ptgo;
	}

	/* Setup offsets VB info */
	VertexBufferInfo info;

	info.attribute_name = m_offsets_attribute_name;
	info.n_components   = m_n_offsets_components;
	info.type			= GL_INT;
	info.data			= &m_offsets_buffer_data[0];
	info.data_size		= (glw::GLuint)(m_offsets_buffer_data.size() * sizeof(glw::GLint));

	/* Add VB info to vector */
	vertex_buffer_infos.push_back(info);
}